

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O2

QuotingType __thiscall llvm::yaml::needsQuotes(yaml *this,StringRef S)

{
  yaml yVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  size_type sVar5;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  QuotingType QVar6;
  char *pcVar7;
  uint uVar8;
  StringRef S_00;
  StringRef S_01;
  StringRef S_02;
  StringRef Chars;
  undefined1 local_28 [8];
  StringRef S_local;
  
  S_local.Data = S.Data;
  QVar6 = Single;
  if (S_local.Data != (char *)0x0) {
    local_28 = (undefined1  [8])this;
    bVar2 = StringRef::front((StringRef *)local_28);
    iVar4 = isspace((uint)bVar2);
    if (iVar4 == 0) {
      bVar2 = StringRef::back((StringRef *)local_28);
      iVar4 = isspace((uint)bVar2);
      if ((((iVar4 == 0) &&
           (S_00.Length = extraout_RDX, S_00.Data = S_local.Data,
           bVar3 = isNull((yaml *)local_28,S_00), !bVar3)) &&
          (S_01.Length = extraout_RDX_00, S_01.Data = S_local.Data,
          bVar3 = isBool((yaml *)local_28,S_01), !bVar3)) &&
         (S_02.Length = extraout_RDX_01, S_02.Data = S_local.Data,
         bVar3 = isNumeric((yaml *)local_28,S_02), !bVar3)) {
        Chars.Length = 0x14;
        Chars.Data = "-?:\\,[]{}#&*!|>\'\"%@`";
        sVar5 = StringRef::find_first_of((StringRef *)local_28,Chars,0);
        if (sVar5 != 0) {
          QVar6 = None;
          for (pcVar7 = (char *)0x0; S_local.Data != pcVar7; pcVar7 = pcVar7 + 1) {
            yVar1 = *(yaml *)((long)local_28 + (long)pcVar7);
            if ((9 < (byte)((char)yVar1 - 0x30U)) && (0x19 < (byte)(((byte)yVar1 & 0xdf) + 0xbf))) {
              uVar8 = (uint)(byte)yVar1;
              if ((byte)yVar1 < 0x2f) {
                if ((0x700100000200U >> ((ulong)uVar8 & 0x3f) & 1) == 0) {
                  if ((0x2400UL >> ((ulong)uVar8 & 0x3f) & 1) == 0) goto LAB_00b58420;
                  QVar6 = Single;
                }
              }
              else {
LAB_00b58420:
                if (1 < (byte)yVar1 - 0x5e) {
                  if (uVar8 == 0x7f) {
                    return Double;
                  }
                  QVar6 = Single;
                  if ((char)yVar1 < ' ') {
                    return Double;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return QVar6;
}

Assistant:

inline QuotingType needsQuotes(StringRef S) {
  if (S.empty())
    return QuotingType::Single;
  if (isspace(static_cast<unsigned char>(S.front())) ||
      isspace(static_cast<unsigned char>(S.back())))
    return QuotingType::Single;
  if (isNull(S))
    return QuotingType::Single;
  if (isBool(S))
    return QuotingType::Single;
  if (isNumeric(S))
    return QuotingType::Single;

  // 7.3.3 Plain Style
  // Plain scalars must not begin with most indicators, as this would cause
  // ambiguity with other YAML constructs.
  static constexpr char Indicators[] = R"(-?:\,[]{}#&*!|>'"%@`)";
  if (S.find_first_of(Indicators) == 0)
    return QuotingType::Single;

  QuotingType MaxQuotingNeeded = QuotingType::None;
  for (unsigned char C : S) {
    // Alphanum is safe.
    if (isAlnum(C))
      continue;

    switch (C) {
    // Safe scalar characters.
    case '_':
    case '-':
    case '^':
    case '.':
    case ',':
    case ' ':
    // TAB (0x9) is allowed in unquoted strings.
    case 0x9:
      continue;
    // LF(0xA) and CR(0xD) may delimit values and so require at least single
    // quotes.
    case 0xA:
    case 0xD:
      MaxQuotingNeeded = QuotingType::Single;
      continue;
    // DEL (0x7F) are excluded from the allowed character range.
    case 0x7F:
      return QuotingType::Double;
    // Forward slash is allowed to be unquoted, but we quote it anyway.  We have
    // many tests that use FileCheck against YAML output, and this output often
    // contains paths.  If we quote backslashes but not forward slashes then
    // paths will come out either quoted or unquoted depending on which platform
    // the test is run on, making FileCheck comparisons difficult.
    case '/':
    default: {
      // C0 control block (0x0 - 0x1F) is excluded from the allowed character
      // range.
      if (C <= 0x1F)
        return QuotingType::Double;

      // Always double quote UTF-8.
      if ((C & 0x80) != 0)
        return QuotingType::Double;

      // The character is not safe, at least simple quoting needed.
      MaxQuotingNeeded = QuotingType::Single;
    }
    }
  }

  return MaxQuotingNeeded;
}